

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void block(LexState *ls)

{
  FuncState *fs;
  BlockCnt bl;
  BlockCnt BStack_28;
  
  fs = ls->fs;
  enterblock(fs,&BStack_28,'\0');
  statlist(ls);
  leaveblock(fs);
  return;
}

Assistant:

static void block (LexState *ls) {
  /* block -> statlist */
  FuncState *fs = ls->fs;
  BlockCnt bl;
  enterblock(fs, &bl, 0);
  statlist(ls);
  leaveblock(fs);
}